

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::buildInput((anonymous_namespace)::BuildContext&,llbuild::ninja::Node*)::
NinjaInputTask::inputsAvailable(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  bool bVar1;
  long lVar2;
  FileInfo *pFVar3;
  anon_union_80_2_ecfed234_for_valueData *paVar4;
  byte bVar5;
  TaskInterface ti_local;
  undefined1 local_d8 [28];
  undefined4 uStack_bc;
  anon_union_80_2_ecfed234_for_valueData aStack_b8;
  undefined8 local_68;
  FileInfo outputInfo;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  bVar5 = 0;
  if (*(char *)(*(long *)((long)this + 8) + 0x91) == '\x01') {
    local_d8._24_4_ = 0;
    uStack_bc = 1;
    pFVar3 = &outputInfo;
  }
  else {
    llbuild::basic::FileInfo::getInfoForPath(&outputInfo,*(string **)((long)this + 0x10),false);
    bVar1 = llbuild::basic::FileInfo::isMissing(&outputInfo);
    if (!bVar1) {
      local_d8._24_4_ = 0;
      uStack_bc = 1;
      local_68 = 0;
      pFVar3 = &outputInfo;
      paVar4 = &aStack_b8;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        (paVar4->asOutputInfo).device = pFVar3->device;
        pFVar3 = (FileInfo *)((long)pFVar3 + (ulong)bVar5 * -0x10 + 8);
        paVar4 = (anon_union_80_2_ecfed234_for_valueData *)
                 (&paVar4->asOutputInfos + (ulong)bVar5 * -2 + 1);
      }
      anon_unknown.dwarf_988a7::BuildValue::toValue
                ((ValueType *)local_d8,(BuildValue *)(local_d8 + 0x18));
      llbuild::core::TaskInterface::complete(&ti_local,(ValueType *)local_d8,false);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
      goto LAB_0012512b;
    }
    local_d8._24_4_ = 1;
    uStack_bc = 0;
    pFVar3 = (FileInfo *)local_d8;
  }
  aStack_b8._48_4_ = 0;
  aStack_b8._64_4_ = 0;
  aStack_b8._68_4_ = 0;
  aStack_b8._60_4_ = 0;
  aStack_b8._57_3_ = 0;
  aStack_b8._52_5_ = 0;
  aStack_b8.asOutputInfo.modTime.nanoseconds._4_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.nanoseconds._5_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.nanoseconds._6_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.nanoseconds._7_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.nanoseconds._0_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.nanoseconds._1_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.nanoseconds._2_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.nanoseconds._3_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.seconds._4_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.seconds._5_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.seconds._6_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.seconds._7_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.seconds._0_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.seconds._1_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.seconds._2_1_ = '\0';
  aStack_b8.asOutputInfo.modTime.seconds._3_1_ = '\0';
  aStack_b8.asOutputInfo.size._4_1_ = '\0';
  aStack_b8.asOutputInfo.size._5_1_ = '\0';
  aStack_b8.asOutputInfo.size._6_1_ = '\0';
  aStack_b8.asOutputInfo.size._7_1_ = '\0';
  aStack_b8.asOutputInfo.size._0_1_ = '\0';
  aStack_b8.asOutputInfo.size._1_1_ = '\0';
  aStack_b8.asOutputInfo.size._2_1_ = '\0';
  aStack_b8.asOutputInfo.size._3_1_ = '\0';
  aStack_b8.asOutputInfo.mode._4_1_ = '\0';
  aStack_b8.asOutputInfo.mode._5_1_ = '\0';
  aStack_b8.asOutputInfo.mode._6_1_ = '\0';
  aStack_b8.asOutputInfo.mode._7_1_ = '\0';
  aStack_b8.asOutputInfo.mode._0_1_ = '\0';
  aStack_b8.asOutputInfo.mode._1_1_ = '\0';
  aStack_b8.asOutputInfo.mode._2_1_ = '\0';
  aStack_b8.asOutputInfo.mode._3_1_ = '\0';
  aStack_b8.asOutputInfo.inode._4_4_ = 0;
  aStack_b8.asOutputInfo.inode._0_4_ = 0;
  aStack_b8.asOutputInfo.device._4_4_ = 0;
  aStack_b8.asOutputInfo.device._0_4_ = 0;
  local_68 = 0;
  aStack_b8._76_4_ = 0;
  aStack_b8._72_4_ = 0;
  anon_unknown.dwarf_988a7::BuildValue::toValue((ValueType *)pFVar3,(BuildValue *)(local_d8 + 0x18))
  ;
  llbuild::core::TaskInterface::complete(&ti_local,(ValueType *)pFVar3,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pFVar3);
LAB_0012512b:
  anon_unknown.dwarf_988a7::BuildValue::~BuildValue((BuildValue *)(local_d8 + 0x18));
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
      if (context.simulate) {
        ti.complete(BuildValue::makeExistingInput({}).toValue());
        return;
      }

      auto outputInfo = FileInfo::getInfoForPath(node->getCanonicalPath());
      if (outputInfo.isMissing()) {
        ti.complete(BuildValue::makeMissingInput().toValue());
        return;
      }

      ti.complete(BuildValue::makeExistingInput(outputInfo).toValue());
    }